

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O0

void __thiscall VulkanUtilities::VulkanCommandBuffer::EndRenderPass(VulkanCommandBuffer *this)

{
  undefined *puVar1;
  Char *pCVar2;
  undefined8 uVar3;
  char (*in_RCX) [32];
  undefined1 local_80 [8];
  string _msg;
  string msg_1;
  undefined1 local_30 [8];
  string msg;
  VulkanCommandBuffer *this_local;
  
  msg.field_2._8_8_ = this;
  if ((this->m_State).RenderPass == (VkRenderPass)0x0) {
    Diligent::FormatString<char[33]>
              ((string *)local_30,(char (*) [33])"Render pass has not been started");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [32])0x14d;
    Diligent::DebugAssertionFailed
              (pCVar2,"EndRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x14d);
    std::__cxx11::string::~string((string *)local_30);
  }
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              ((string *)((long)&_msg.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",in_RCX);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar2,"EndRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x14e);
    std::__cxx11::string::~string((string *)(_msg.field_2._M_local_buf + 8));
  }
  (*vkCmdEndRenderPass)(this->m_VkCmdBuffer);
  (this->m_State).RenderPass = (VkRenderPass)0x0;
  (this->m_State).Framebuffer = (VkFramebuffer)0x0;
  (this->m_State).FramebufferWidth = 0;
  (this->m_State).FramebufferHeight = 0;
  if ((this->m_State).InsidePassQueries != 0) {
    Diligent::FormatString<char[435]>
              ((string *)local_80,
               (char (*) [435])
               "Ending render pass while there are outstanding queries that have been started inside the pass, but have not been ended. Vulkan requires that a query must either begin and end inside the same subpass of a render pass instance, or must both begin and end outside of a render pass instance (i.e. contain entire render pass instances). (https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdEndRenderPass-None-07004)"
              );
    puVar1 = Diligent::DebugMessageCallback;
    if (Diligent::DebugMessageCallback != (undefined *)0x0) {
      uVar3 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(2,uVar3,0);
    }
    std::__cxx11::string::~string((string *)local_80);
  }
  return;
}

Assistant:

__forceinline void EndRenderPass()
    {
        VERIFY(m_State.RenderPass != VK_NULL_HANDLE, "Render pass has not been started");
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        vkCmdEndRenderPass(m_VkCmdBuffer);
        m_State.RenderPass        = VK_NULL_HANDLE;
        m_State.Framebuffer       = VK_NULL_HANDLE;
        m_State.FramebufferWidth  = 0;
        m_State.FramebufferHeight = 0;
        if (m_State.InsidePassQueries != 0)
        {
            LOG_ERROR_MESSAGE("Ending render pass while there are outstanding queries that have been started inside the pass, "
                              "but have not been ended. Vulkan requires that a query must either begin and end inside the same "
                              "subpass of a render pass instance, or must both begin and end outside of a render pass "
                              "instance (i.e. contain entire render pass instances). "
                              "(https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdEndRenderPass-None-07004)");
        }
    }